

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_output_chain.c
# Opt level: O0

ngx_int_t ngx_output_chain_copy_buf(ngx_output_chain_ctx_t *ctx)

{
  ngx_buf_t *pnVar1;
  ngx_buf_t *pnVar2;
  size_t sVar3;
  bool bVar4;
  size_t local_50;
  size_t local_48;
  ngx_uint_t sendfile;
  ngx_buf_t *dst;
  ngx_buf_t *src;
  ssize_t n;
  off_t size;
  ngx_output_chain_ctx_t *ctx_local;
  
  pnVar1 = ctx->in->buf;
  pnVar2 = ctx->buf;
  if ((((*(ushort *)&pnVar1->field_0x48 & 1) == 0) &&
      ((*(ushort *)&pnVar1->field_0x48 >> 1 & 1) == 0)) &&
     ((*(ushort *)&pnVar1->field_0x48 >> 2 & 1) == 0)) {
    local_48 = pnVar1->file_last - pnVar1->file_pos;
  }
  else {
    local_48 = (long)pnVar1->last - (long)pnVar1->pos;
  }
  if ((long)pnVar2->end - (long)pnVar2->pos < (long)local_48) {
    local_50 = (long)pnVar2->end - (long)pnVar2->pos;
  }
  else {
    local_50 = local_48;
  }
  bVar4 = false;
  if ((ctx->field_0x20 & 1) != 0) {
    bVar4 = ((byte)ctx->field_0x20 >> 1 & 1) == 0;
  }
  if (((*(ushort *)&pnVar1->field_0x48 >> 4 & 1) != 0) && (0x7fffffff < pnVar1->file_pos)) {
    bVar4 = false;
  }
  if ((((*(ushort *)&pnVar1->field_0x48 & 1) == 0) &&
      ((*(ushort *)&pnVar1->field_0x48 >> 1 & 1) == 0)) &&
     ((*(ushort *)&pnVar1->field_0x48 >> 2 & 1) == 0)) {
    sVar3 = ngx_read_file(pnVar1->file,pnVar2->pos,local_50,pnVar1->file_pos);
    if (sVar3 == 0xffffffffffffffff) {
      return -1;
    }
    if (sVar3 != local_50) {
      if (1 < ctx->pool->log->log_level) {
        ngx_log_error_core(2,ctx->pool->log,0,"pread() read only %z of %O from \"%s\"",sVar3,
                           local_50,(pnVar1->file->name).data);
      }
      return -1;
    }
    pnVar2->last = pnVar2->last + sVar3;
    if (bVar4) {
      *(ushort *)&pnVar2->field_0x48 = *(ushort *)&pnVar2->field_0x48 & 0xffef | 0x10;
      pnVar2->file = pnVar1->file;
      pnVar2->file_pos = pnVar1->file_pos;
      pnVar2->file_last = pnVar1->file_pos + sVar3;
    }
    else {
      *(ushort *)&pnVar2->field_0x48 = *(ushort *)&pnVar2->field_0x48 & 0xffef;
    }
    pnVar1->file_pos = sVar3 + pnVar1->file_pos;
    if (pnVar1->file_pos == pnVar1->file_last) {
      *(ushort *)&pnVar2->field_0x48 =
           *(ushort *)&pnVar2->field_0x48 & 0xffdf | (*(ushort *)&pnVar1->field_0x48 >> 5 & 1) << 5;
      *(ushort *)&pnVar2->field_0x48 =
           *(ushort *)&pnVar2->field_0x48 & 0xff7f | (*(ushort *)&pnVar1->field_0x48 >> 7 & 1) << 7;
      *(ushort *)&pnVar2->field_0x48 =
           *(ushort *)&pnVar2->field_0x48 & 0xfeff | (*(ushort *)&pnVar1->field_0x48 >> 8 & 1) << 8;
    }
  }
  else {
    memcpy(pnVar2->pos,pnVar1->pos,local_50);
    pnVar1->pos = pnVar1->pos + local_50;
    pnVar2->last = pnVar2->last + local_50;
    if ((*(ushort *)&pnVar1->field_0x48 >> 4 & 1) == 0) {
      *(ushort *)&pnVar2->field_0x48 = *(ushort *)&pnVar2->field_0x48 & 0xffef;
    }
    else {
      if (bVar4) {
        *(ushort *)&pnVar2->field_0x48 = *(ushort *)&pnVar2->field_0x48 & 0xffef | 0x10;
        pnVar2->file = pnVar1->file;
        pnVar2->file_pos = pnVar1->file_pos;
        pnVar2->file_last = pnVar1->file_pos + local_50;
      }
      else {
        *(ushort *)&pnVar2->field_0x48 = *(ushort *)&pnVar2->field_0x48 & 0xffef;
      }
      pnVar1->file_pos = local_50 + pnVar1->file_pos;
    }
    if (pnVar1->pos == pnVar1->last) {
      *(ushort *)&pnVar2->field_0x48 =
           *(ushort *)&pnVar2->field_0x48 & 0xffdf | (*(ushort *)&pnVar1->field_0x48 >> 5 & 1) << 5;
      *(ushort *)&pnVar2->field_0x48 =
           *(ushort *)&pnVar2->field_0x48 & 0xff7f | (*(ushort *)&pnVar1->field_0x48 >> 7 & 1) << 7;
      *(ushort *)&pnVar2->field_0x48 =
           *(ushort *)&pnVar2->field_0x48 & 0xfeff | (*(ushort *)&pnVar1->field_0x48 >> 8 & 1) << 8;
    }
  }
  return 0;
}

Assistant:

static ngx_int_t
ngx_output_chain_copy_buf(ngx_output_chain_ctx_t *ctx)
{
    off_t        size;
    ssize_t      n;
    ngx_buf_t   *src, *dst;
    ngx_uint_t   sendfile;

    src = ctx->in->buf;
    dst = ctx->buf;

    size = ngx_buf_size(src);
    size = ngx_min(size, dst->end - dst->pos);

    sendfile = ctx->sendfile && !ctx->directio;

#if (NGX_SENDFILE_LIMIT)

    if (src->in_file && src->file_pos >= NGX_SENDFILE_LIMIT) {
        sendfile = 0;
    }

#endif

    if (ngx_buf_in_memory(src)) {
        ngx_memcpy(dst->pos, src->pos, (size_t) size);
        src->pos += (size_t) size;
        dst->last += (size_t) size;

        if (src->in_file) {

            if (sendfile) {
                dst->in_file = 1;
                dst->file = src->file;
                dst->file_pos = src->file_pos;
                dst->file_last = src->file_pos + size;

            } else {
                dst->in_file = 0;
            }

            src->file_pos += size;

        } else {
            dst->in_file = 0;
        }

        if (src->pos == src->last) {
            dst->flush = src->flush;
            dst->last_buf = src->last_buf;
            dst->last_in_chain = src->last_in_chain;
        }

    } else {

#if (NGX_HAVE_ALIGNED_DIRECTIO)

        if (ctx->unaligned) {
            if (ngx_directio_off(src->file->fd) == NGX_FILE_ERROR) {
                ngx_log_error(NGX_LOG_ALERT, ctx->pool->log, ngx_errno,
                              ngx_directio_off_n " \"%s\" failed",
                              src->file->name.data);
            }
        }

#endif

#if (NGX_HAVE_FILE_AIO)
        if (ctx->aio_handler) {
            n = ngx_file_aio_read(src->file, dst->pos, (size_t) size,
                                  src->file_pos, ctx->pool);
            if (n == NGX_AGAIN) {
                ctx->aio_handler(ctx, src->file);
                return NGX_AGAIN;
            }

        } else
#endif
#if (NGX_THREADS)
        if (ctx->thread_handler) {
            src->file->thread_task = ctx->thread_task;
            src->file->thread_handler = ctx->thread_handler;
            src->file->thread_ctx = ctx->filter_ctx;

            n = ngx_thread_read(src->file, dst->pos, (size_t) size,
                                src->file_pos, ctx->pool);
            if (n == NGX_AGAIN) {
                ctx->thread_task = src->file->thread_task;
                return NGX_AGAIN;
            }

        } else
#endif
        {
            n = ngx_read_file(src->file, dst->pos, (size_t) size,
                              src->file_pos);
        }

#if (NGX_HAVE_ALIGNED_DIRECTIO)

        if (ctx->unaligned) {
            ngx_err_t  err;

            err = ngx_errno;

            if (ngx_directio_on(src->file->fd) == NGX_FILE_ERROR) {
                ngx_log_error(NGX_LOG_ALERT, ctx->pool->log, ngx_errno,
                              ngx_directio_on_n " \"%s\" failed",
                              src->file->name.data);
            }

            ngx_set_errno(err);

            ctx->unaligned = 0;
        }

#endif

        if (n == NGX_ERROR) {
            return (ngx_int_t) n;
        }

        if (n != size) {
            ngx_log_error(NGX_LOG_ALERT, ctx->pool->log, 0,
                          ngx_read_file_n " read only %z of %O from \"%s\"",
                          n, size, src->file->name.data);
            return NGX_ERROR;
        }

        dst->last += n;

        if (sendfile) {
            dst->in_file = 1;
            dst->file = src->file;
            dst->file_pos = src->file_pos;
            dst->file_last = src->file_pos + n;

        } else {
            dst->in_file = 0;
        }

        src->file_pos += n;

        if (src->file_pos == src->file_last) {
            dst->flush = src->flush;
            dst->last_buf = src->last_buf;
            dst->last_in_chain = src->last_in_chain;
        }
    }

    return NGX_OK;
}